

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavProcessItem(ImGuiWindow *window,ImRect *nav_bb,ImGuiID id)

{
  undefined8 uVar1;
  uint uVar2;
  ImGuiNavLayer IVar3;
  ImRect cand;
  ImRect cand_00;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID in_EDX;
  ImRect *in_RSI;
  ImGuiWindow *in_RDI;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  float VISIBLE_RATIO;
  bool new_best;
  ImGuiNavMoveResult *result;
  ImRect nav_bb_rel;
  ImGuiItemFlags item_flags;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ImGuiNavMoveResult *local_90;
  undefined4 in_stack_ffffffffffffffb8;
  float fVar10;
  ImVec2 IVar11;
  ImVec2 in_stack_ffffffffffffffcc;
  ImVec2 local_2c;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  pIVar4 = GImGui;
  uVar2 = (in_RDI->DC).ItemFlags;
  auVar8._0_8_ = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                             ,(ImVec2 *)0x1c9408);
  auVar8._8_56_ = extraout_var;
  IVar11 = (ImVec2)vmovlpd_avx(auVar8._0_16_);
  auVar9._0_8_ = ::operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
                             ,(ImVec2 *)0x1c942b);
  auVar9._8_56_ = extraout_var_00;
  uVar1 = vmovlpd_avx(auVar9._0_16_);
  fVar10 = (float)uVar1;
  ImRect::ImRect((ImRect *)&stack0xffffffffffffffcc,(ImVec2 *)&stack0xffffffffffffffc4,
                 (ImVec2 *)&stack0xffffffffffffffbc);
  if (((pIVar4->NavInitRequest & 1U) != 0) && (pIVar4->NavLayer == (in_RDI->DC).NavLayerCurrent)) {
    if (((uVar2 & 0x10) == 0) || (pIVar4->NavInitResultId == 0)) {
      pIVar4->NavInitResultId = in_EDX;
      (pIVar4->NavInitResultRectRel).Min = in_stack_ffffffffffffffcc;
      (pIVar4->NavInitResultRectRel).Max = local_2c;
    }
    if ((uVar2 & 0x10) == 0) {
      pIVar4->NavInitRequest = false;
      NavUpdateAnyRequestFlag();
    }
  }
  if (((pIVar4->NavId != in_EDX) || ((pIVar4->NavMoveRequestFlags & 0x10U) != 0)) &&
     ((uVar2 & 0xc) == 0)) {
    if (in_RDI == pIVar4->NavWindow) {
      local_90 = &pIVar4->NavMoveResultLocal;
    }
    else {
      local_90 = &pIVar4->NavMoveResultOther;
    }
    bVar5 = false;
    if ((pIVar4->NavMoveRequest & 1U) != 0) {
      cand.Max = in_stack_ffffffffffffffcc;
      cand.Min = IVar11;
      bVar5 = NavScoreItem((ImGuiNavMoveResult *)CONCAT44(fVar10,in_stack_ffffffffffffffb8),cand);
    }
    if (bVar5 != false) {
      NavApplyItemToResult(local_90,in_RDI,in_EDX,(ImRect *)&stack0xffffffffffffffcc);
    }
    if (((pIVar4->NavMoveRequestFlags & 0x20U) != 0) &&
       (bVar5 = ImRect::Overlaps(&in_RDI->ClipRect,in_RSI), bVar5)) {
      fVar6 = ImClamp<float>((in_RSI->Max).y,(in_RDI->ClipRect).Min.y,(in_RDI->ClipRect).Max.y);
      fVar7 = ImClamp<float>((in_RSI->Min).y,(in_RDI->ClipRect).Min.y,(in_RDI->ClipRect).Max.y);
      if ((((in_RSI->Max).y - (in_RSI->Min).y) * 0.7 <= fVar6 - fVar7) &&
         (cand_00.Max = in_stack_ffffffffffffffcc, cand_00.Min = IVar11,
         bVar5 = NavScoreItem((ImGuiNavMoveResult *)CONCAT44(fVar10,in_stack_ffffffffffffffb8),
                              cand_00), bVar5)) {
        NavApplyItemToResult
                  (&pIVar4->NavMoveResultLocalVisibleSet,in_RDI,in_EDX,
                   (ImRect *)&stack0xffffffffffffffcc);
      }
    }
  }
  if (pIVar4->NavId == in_EDX) {
    pIVar4->NavWindow = in_RDI;
    pIVar4->NavLayer = (in_RDI->DC).NavLayerCurrent;
    pIVar4->NavFocusScopeId = (in_RDI->DC).NavFocusScopeIdCurrent;
    pIVar4->NavIdIsAlive = true;
    pIVar4->NavIdTabCounter = (in_RDI->DC).FocusCounterTabStop;
    IVar3 = (in_RDI->DC).NavLayerCurrent;
    in_RDI->NavRectRel[IVar3].Min = in_stack_ffffffffffffffcc;
    (&in_RDI->NavRectRel[IVar3].Min)[1] = local_2c;
  }
  return;
}

Assistant:

static void ImGui::NavProcessItem(ImGuiWindow* window, const ImRect& nav_bb, const ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    //if (!g.IO.NavActive)  // [2017/10/06] Removed this possibly redundant test but I am not sure of all the side-effects yet. Some of the feature here will need to work regardless of using a _NoNavInputs flag.
    //    return;

    const ImGuiItemFlags item_flags = window->DC.ItemFlags;
    const ImRect nav_bb_rel(nav_bb.Min - window->Pos, nav_bb.Max - window->Pos);

    // Process Init Request
    if (g.NavInitRequest && g.NavLayer == window->DC.NavLayerCurrent)
    {
        // Even if 'ImGuiItemFlags_NoNavDefaultFocus' is on (typically collapse/close button) we record the first ResultId so they can be used as a fallback
        if (!(item_flags & ImGuiItemFlags_NoNavDefaultFocus) || g.NavInitResultId == 0)
        {
            g.NavInitResultId = id;
            g.NavInitResultRectRel = nav_bb_rel;
        }
        if (!(item_flags & ImGuiItemFlags_NoNavDefaultFocus))
        {
            g.NavInitRequest = false; // Found a match, clear request
            NavUpdateAnyRequestFlag();
        }
    }

    // Process Move Request (scoring for navigation)
    // FIXME-NAV: Consider policy for double scoring (scoring from NavScoringRectScreen + scoring from a rect wrapped according to current wrapping policy)
    if ((g.NavId != id || (g.NavMoveRequestFlags & ImGuiNavMoveFlags_AllowCurrentNavId)) && !(item_flags & (ImGuiItemFlags_Disabled | ImGuiItemFlags_NoNav)))
    {
        ImGuiNavMoveResult* result = (window == g.NavWindow) ? &g.NavMoveResultLocal : &g.NavMoveResultOther;
#if IMGUI_DEBUG_NAV_SCORING
        // [DEBUG] Score all items in NavWindow at all times
        if (!g.NavMoveRequest)
            g.NavMoveDir = g.NavMoveDirLast;
        bool new_best = NavScoreItem(result, nav_bb) && g.NavMoveRequest;
#else
        bool new_best = g.NavMoveRequest && NavScoreItem(result, nav_bb);
#endif
        if (new_best)
            NavApplyItemToResult(result, window, id, nav_bb_rel);

        // Features like PageUp/PageDown need to maintain a separate score for the visible set of items.
        const float VISIBLE_RATIO = 0.70f;
        if ((g.NavMoveRequestFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet) && window->ClipRect.Overlaps(nav_bb))
            if (ImClamp(nav_bb.Max.y, window->ClipRect.Min.y, window->ClipRect.Max.y) - ImClamp(nav_bb.Min.y, window->ClipRect.Min.y, window->ClipRect.Max.y) >= (nav_bb.Max.y - nav_bb.Min.y) * VISIBLE_RATIO)
                if (NavScoreItem(&g.NavMoveResultLocalVisibleSet, nav_bb))
                    NavApplyItemToResult(&g.NavMoveResultLocalVisibleSet, window, id, nav_bb_rel);
    }

    // Update window-relative bounding box of navigated item
    if (g.NavId == id)
    {
        g.NavWindow = window;                                           // Always refresh g.NavWindow, because some operations such as FocusItem() don't have a window.
        g.NavLayer = window->DC.NavLayerCurrent;
        g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
        g.NavIdIsAlive = true;
        g.NavIdTabCounter = window->DC.FocusCounterTabStop;
        window->NavRectRel[window->DC.NavLayerCurrent] = nav_bb_rel;    // Store item bounding box (relative to window position)
    }
}